

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  pos_t p;
  pos_t p_00;
  int iVar2;
  int iVar3;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  node_t_conflict pnVar7;
  char *pcVar8;
  node_code_t nVar9;
  pos_t p_01;
  pos_t p_02;
  pos_t p_03;
  pos_t pos;
  node_t_conflict local_48;
  node_t_conflict local_40;
  node_t_conflict local_38;
  
  ppVar1 = c2m_ctx->parse_ctx;
  pnVar4 = new_node(c2m_ctx,N_LIST);
  while (pnVar5 = try_f(c2m_ctx,label), pnVar5 != &err_struct) {
    op_append(c2m_ctx,pnVar4,pnVar5);
  }
  if (*(short *)ppVar1->curr_token == 0x7b) {
    pnVar5 = compound_stmt(c2m_ctx,no_err_p);
    if (pnVar5 == &err_struct) {
      return &err_struct;
    }
    if ((pnVar4->u).s.s == (char *)0x0) {
      return pnVar5;
    }
    pnVar6 = (pnVar5->u).ops.head;
    if ((pnVar6->code == N_LIST) && ((pnVar6->u).s.s == (char *)0x0)) {
      DLIST_node_t_remove(&(pnVar5->u).ops,pnVar6);
      DLIST_node_t_prepend(&(pnVar5->u).ops,pnVar4);
      return pnVar5;
    }
    __assert_fail("NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x143a,"node_t stmt(c2m_ctx_t, int)");
  }
  iVar2 = match(c2m_ctx,0x129,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    iVar2 = match(c2m_ctx,0x135,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      iVar2 = match(c2m_ctx,0x13c,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        iVar2 = match(c2m_ctx,0x121,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          iVar2 = match(c2m_ctx,0x127,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 != 0) {
            iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar2 != 0) {
              p_00.lno = pos.lno;
              p_00.ln_pos = pos.ln_pos;
              p_00.fname = pos.fname;
              pnVar5 = new_pos_node(c2m_ctx,N_FOR,p_00);
              pnVar5->attr = ppVar1->curr_scope;
              ppVar1->curr_scope = pnVar5;
              local_48 = try_f(c2m_ctx,declaration);
              ppVar1->curr_scope = (node_t_conflict)pnVar5->attr;
              if (local_48 == &err_struct) {
                iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar2 == 0) {
                  local_48 = expr(c2m_ctx,no_err_p);
                  if (local_48 == &err_struct) {
                    return &err_struct;
                  }
                  iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0)
                  ;
                  if (iVar2 == 0) goto LAB_00167d7c;
                }
                else {
                  local_48 = new_node(c2m_ctx,N_IGNORE);
                }
              }
              iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 == 0) {
                local_38 = expr(c2m_ctx,no_err_p);
                if (local_38 == &err_struct) {
                  return &err_struct;
                }
                iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar2 == 0) goto LAB_00167d7c;
              }
              else {
                local_38 = new_node(c2m_ctx,N_IGNORE);
              }
              if (*(short *)ppVar1->curr_token == 0x29) {
                pnVar6 = new_node(c2m_ctx,N_IGNORE);
              }
              else {
                pnVar6 = expr(c2m_ctx,no_err_p);
                if (pnVar6 == &err_struct) goto LAB_00167d3a;
              }
              iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 != 0) {
                pnVar7 = stmt(c2m_ctx,no_err_p);
                if (pnVar7 == &err_struct) {
                  return &err_struct;
                }
                op_append(c2m_ctx,pnVar5,pnVar4);
                op_append(c2m_ctx,pnVar5,local_48);
                op_append(c2m_ctx,pnVar5,local_38);
                op_append(c2m_ctx,pnVar5,pnVar6);
                op_append(c2m_ctx,pnVar5,pnVar7);
                return pnVar5;
              }
              if (ppVar1->record_level == 0) {
                pcVar8 = get_token_name(c2m_ctx,0x29);
                syntax_error(c2m_ctx,pcVar8);
              }
LAB_00167d3a:
              return &err_struct;
            }
            goto LAB_00167ad5;
          }
          iVar2 = match(c2m_ctx,0x128,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 == 0) {
            iVar2 = match(c2m_ctx,0x11f,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar2 == 0) {
              iVar2 = match(c2m_ctx,0x11b,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 != 0) {
                iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar2 != 0) {
                  nVar9 = N_BREAK;
                  goto LAB_00167dcb;
                }
                goto LAB_00167ddc;
              }
              iVar2 = match(c2m_ctx,0x12f,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 != 0) {
                iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar2 == 0) {
                  pnVar5 = expr(c2m_ctx,no_err_p);
                  if (pnVar5 == &err_struct) {
                    return &err_struct;
                  }
                  iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0)
                  ;
                  if (iVar2 == 0) goto LAB_00167d7c;
                }
                else {
                  pnVar5 = new_node(c2m_ctx,N_IGNORE);
                }
                p_03.lno = pos.lno;
                p_03.ln_pos = pos.ln_pos;
                p_03.fname = pos.fname;
                nVar9 = N_RETURN;
                goto LAB_00167d13;
              }
              if (*(short *)ppVar1->curr_token == 0x3b) {
                pnVar5 = new_node(c2m_ctx,N_IGNORE);
              }
              else {
                pnVar5 = expr(c2m_ctx,no_err_p);
                if (pnVar5 == &err_struct) {
                  return &err_struct;
                }
              }
              local_40 = pnVar5;
              iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 != 0) {
                p_03 = get_node_pos(c2m_ctx,pnVar5);
                nVar9 = N_EXPR;
                goto LAB_00167d13;
              }
              goto LAB_00167f12;
            }
            iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar2 != 0) {
              nVar9 = N_CONTINUE;
LAB_00167dcb:
              p_02.lno = pos.lno;
              p_02.ln_pos = pos.ln_pos;
              p_02.fname = pos.fname;
              pnVar4 = new_pos_node1(c2m_ctx,nVar9,p_02,pnVar4);
              return pnVar4;
            }
LAB_00167ddc:
            iVar2 = ppVar1->record_level;
joined_r0x00167de1:
            if (iVar2 != 0) goto LAB_00167af2;
            iVar2 = 0x3b;
            goto LAB_00167ade;
          }
          iVar2 = match(c2m_ctx,0x2a,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 != 0) {
            local_40 = expr(c2m_ctx,no_err_p);
            if (local_40 == &err_struct) {
              return &err_struct;
            }
LAB_00167cda:
            iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar3 != 0) {
              p_03.lno = pos.lno;
              p_03.ln_pos = pos.ln_pos;
              p_03.fname = pos.fname;
              nVar9 = N_INDIRECT_GOTO - (iVar2 == 0);
              pnVar5 = local_40;
LAB_00167d13:
              pnVar4 = new_pos_node2(c2m_ctx,nVar9,p_03,pnVar4,pnVar5);
              return pnVar4;
            }
LAB_00167f12:
            iVar2 = ppVar1->record_level;
            goto joined_r0x00167de1;
          }
          iVar3 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&local_40);
          if (iVar3 != 0) goto LAB_00167cda;
          if (ppVar1->record_level != 0) goto LAB_00167af2;
          pcVar8 = "identifier";
          goto LAB_00167aed;
        }
        pnVar6 = stmt(c2m_ctx,no_err_p);
        if (pnVar6 == &err_struct) {
          return &err_struct;
        }
        iVar2 = match(c2m_ctx,0x13c,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          iVar2 = 0x13c;
          goto LAB_00167993;
        }
        iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          iVar2 = 0x28;
          goto LAB_00167993;
        }
        pnVar5 = expr(c2m_ctx,no_err_p);
        if (pnVar5 == &err_struct) {
          return &err_struct;
        }
        iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 != 0) {
          iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 != 0) {
            nVar9 = N_DO;
            goto LAB_00167886;
          }
LAB_00167d7c:
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          iVar2 = 0x3b;
          goto LAB_00167993;
        }
      }
      else {
        iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) goto LAB_00167ad5;
        pnVar5 = expr(c2m_ctx,no_err_p);
        if (pnVar5 == &err_struct) {
          return &err_struct;
        }
        iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 != 0) {
          pnVar6 = stmt(c2m_ctx,no_err_p);
          if (pnVar6 == &err_struct) {
            return &err_struct;
          }
          nVar9 = N_WHILE;
          goto LAB_00167886;
        }
      }
    }
    else {
      iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) goto LAB_00167ad5;
      pnVar5 = expr(c2m_ctx,no_err_p);
      if (pnVar5 == &err_struct) {
        return &err_struct;
      }
      iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 != 0) {
        pnVar6 = stmt(c2m_ctx,no_err_p);
        if (pnVar6 == &err_struct) {
          return &err_struct;
        }
        nVar9 = N_SWITCH;
LAB_00167886:
        p_01.lno = pos.lno;
        p_01.ln_pos = pos.ln_pos;
        p_01.fname = pos.fname;
        pnVar4 = new_pos_node3(c2m_ctx,nVar9,p_01,pnVar4,pnVar5,pnVar6);
        return pnVar4;
      }
    }
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    iVar2 = 0x29;
LAB_00167993:
    pcVar8 = get_token_name(c2m_ctx,iVar2);
    syntax_error(c2m_ctx,pcVar8);
    return &err_struct;
  }
  iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
LAB_00167ad5:
    if (ppVar1->record_level != 0) goto LAB_00167af2;
    iVar2 = 0x28;
  }
  else {
    pnVar5 = expr(c2m_ctx,no_err_p);
    if (pnVar5 == &err_struct) goto LAB_00167af2;
    iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 != 0) {
      pnVar6 = stmt(c2m_ctx,no_err_p);
      if (pnVar6 == &err_struct) {
        return &err_struct;
      }
      iVar2 = match(c2m_ctx,0x123,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        pnVar7 = new_node(c2m_ctx,N_IGNORE);
      }
      else {
        pnVar7 = stmt(c2m_ctx,no_err_p);
        if (pnVar7 == &err_struct) {
          return &err_struct;
        }
      }
      p.lno = pos.lno;
      p.ln_pos = pos.ln_pos;
      p.fname = pos.fname;
      pnVar4 = new_pos_node4(c2m_ctx,N_IF,p,pnVar4,pnVar5,pnVar6,pnVar7);
      return pnVar4;
    }
    if (ppVar1->record_level != 0) goto LAB_00167af2;
    iVar2 = 0x29;
  }
LAB_00167ade:
  pcVar8 = get_token_name(c2m_ctx,iVar2);
LAB_00167aed:
  syntax_error(c2m_ctx,pcVar8);
LAB_00167af2:
  return &err_struct;
}

Assistant:

D (stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t l, n, op1, op2, op3, r;
  pos_t pos;

  l = new_node (c2m_ctx, N_LIST);
  while ((op1 = TRY (label)) != err_node) {
    op_append (c2m_ctx, l, op1);
  }
  if (C ('{')) {
    P (compound_stmt);
    if (NL_HEAD (l->u.ops) != NULL) { /* replace empty label list */
      assert (NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL);
      NL_REMOVE (r->u.ops, NL_HEAD (r->u.ops));
      NL_PREPEND (r->u.ops, l);
    }
  } else if (MP (T_IF, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    op2 = r;
    if (!M (T_ELSE)) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (stmt);
    }
    r = new_pos_node4 (c2m_ctx, N_IF, pos, l, op1, op2, r);
  } else if (MP (T_SWITCH, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_SWITCH, pos, l, op1, r);
  } else if (MP (T_WHILE, pos)) { /* iteration-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_WHILE, pos, l, op1, r);
  } else if (M (T_DO)) { /* iteration-statement */
    P (stmt);
    op1 = r;
    PTP (T_WHILE, pos);
    PT ('(');
    P (expr);
    PT (')');
    PT (';');
    r = new_pos_node3 (c2m_ctx, N_DO, pos, l, r, op1);
  } else if (MP (T_FOR, pos)) { /* iteration-statement */
    PT ('(');
    n = new_pos_node (c2m_ctx, N_FOR, pos);
    n->attr = curr_scope;
    curr_scope = n;
    if ((r = TRY (declaration)) != err_node) {
      op1 = r;
      curr_scope = n->attr;
    } else {
      curr_scope = n->attr;
      if (!M (';')) {
        P (expr);
        op1 = r;
        PT (';');
      } else {
        op1 = new_node (c2m_ctx, N_IGNORE);
      }
    }
    if (M (';')) {
      op2 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op2 = r;
      PT (';');
    }
    if (C (')')) {
      op3 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op3 = r;
    }
    PT (')');
    P (stmt);
    op_append (c2m_ctx, n, l);
    op_append (c2m_ctx, n, op1);
    op_append (c2m_ctx, n, op2);
    op_append (c2m_ctx, n, op3);
    op_append (c2m_ctx, n, r);
    r = n;
  } else if (MP (T_GOTO, pos)) { /* jump-statement */
    int indirect_p = FALSE;
    if (!M ('*')) {
      PTN (T_ID);
    } else {
      indirect_p = TRUE;
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, indirect_p ? N_INDIRECT_GOTO : N_GOTO, pos, l, r);
  } else if (MP (T_CONTINUE, pos)) { /* continue-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_CONTINUE, pos, l);
  } else if (MP (T_BREAK, pos)) { /* break-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_BREAK, pos, l);
  } else if (MP (T_RETURN, pos)) { /* return-statement */
    if (M (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      PT (';');
    }
    r = new_pos_node2 (c2m_ctx, N_RETURN, pos, l, r);
  } else { /* expression-statement */
    if (C (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, N_EXPR, POS (r), l, r);
  }
  return r;
}